

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::XFormWidget(XFormWidget *this)

{
  undefined8 *in_RDI;
  Selection *in_stack_ffffffffffffffd0;
  SceneObject *in_stack_fffffffffffffff0;
  
  SceneObject::SceneObject(in_stack_fffffffffffffff0);
  *in_RDI = &PTR_set_draw_styles_003ba6d0;
  Selection::Selection(in_stack_ffffffffffffffd0);
  std::
  map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
  ::map((map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
         *)0x213b5b);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x213b71);
  BBox::BBox((BBox *)this);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x37));
  *(undefined1 *)(in_RDI + 0x3a) = 0;
  Vector2D::Vector2D((Vector2D *)(in_RDI + 0x3e));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)0x213bc2);
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  *(undefined1 *)((long)in_RDI + 0x1d1) = 0;
  *(undefined1 *)((long)in_RDI + 0x1d3) = 0;
  *(undefined1 *)((long)in_RDI + 0x1d2) = 0;
  *(undefined4 *)((long)in_RDI + 0x124) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  return;
}

Assistant:

XFormWidget::XFormWidget() {
  target.object = nullptr;
  target.element = nullptr;
  objectMode = false;
  transformedMode = false;
  poseMode = false;
  mode = lastMode = Mode::Translate;
}